

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

return_type __thiscall
flatbuffers::Vector<keyfield::sample::Baz_const*,unsigned_int>::
LookupByKey<flatbuffers::Array<unsigned_char,(unsigned_short)4>*>
          (Vector<keyfield::sample::Baz_const*,unsigned_int> *this,
          Array<unsigned_char,_(unsigned_short)4> *key)

{
  return_type pBVar1;
  Array<unsigned_char,_(unsigned_short)4> *key_local;
  
  key_local = key;
  pBVar1 = (return_type)
           bsearch(&key_local,this + 4,(ulong)*(uint *)this,5,
                   KeyCompare<flatbuffers::Array<unsigned_char,(unsigned_short)4>*>);
  return pBVar1;
}

Assistant:

return_type LookupByKey(K key) const {
    void *search_result = std::bsearch(
        &key, Data(), size(), IndirectHelper<T>::element_stride, KeyCompare<K>);

    if (!search_result) {
      return nullptr;  // Key not found.
    }

    const uint8_t *element = reinterpret_cast<const uint8_t *>(search_result);

    return IndirectHelper<T>::Read(element, 0);
  }